

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall
irr::video::CNullDriver::swapMaterialRenderers(CNullDriver *this,u32 idx1,u32 idx2,bool swapNames)

{
  u32 uVar1;
  SMaterialRenderer *pSVar2;
  undefined1 in_CL;
  uint in_EDX;
  uint in_ESI;
  undefined8 in_stack_ffffffffffffffc8;
  u32 index;
  array<irr::video::CNullDriver::SMaterialRenderer> *in_stack_ffffffffffffffd0;
  array<irr::video::CNullDriver::SMaterialRenderer> *this_00;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  index = (u32)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  uVar3 = CONCAT13(in_CL,in_stack_ffffffffffffffec) & 0x1ffffff;
  uVar5 = in_ESI;
  uVar1 = core::array<irr::video::CNullDriver::SMaterialRenderer>::size
                    ((array<irr::video::CNullDriver::SMaterialRenderer> *)0x30d0f7);
  if ((in_ESI < uVar1) &&
     (uVar4 = in_EDX,
     uVar1 = core::array<irr::video::CNullDriver::SMaterialRenderer>::size
                       ((array<irr::video::CNullDriver::SMaterialRenderer> *)0x30d11e),
     in_EDX < uVar1)) {
    pSVar2 = core::array<irr::video::CNullDriver::SMaterialRenderer>::operator[]
                       (in_stack_ffffffffffffffd0,index);
    this_00 = (array<irr::video::CNullDriver::SMaterialRenderer> *)&pSVar2->Renderer;
    pSVar2 = core::array<irr::video::CNullDriver::SMaterialRenderer>::operator[](this_00,index);
    core::swap<irr::video::IMaterialRenderer*,irr::video::IMaterialRenderer*>
              ((IMaterialRenderer **)this_00,&pSVar2->Renderer);
    if ((uVar3 & 0x1000000) != 0) {
      pSVar2 = core::array<irr::video::CNullDriver::SMaterialRenderer>::operator[](this_00,index);
      core::array<irr::video::CNullDriver::SMaterialRenderer>::operator[]
                (this_00,(u32)((ulong)pSVar2 >> 0x20));
      core::swap<irr::core::string<char>,irr::core::string<char>>
                ((string<char> *)CONCAT44(uVar5,uVar4),(string<char> *)CONCAT44(uVar3,in_ESI));
    }
  }
  return;
}

Assistant:

void CNullDriver::swapMaterialRenderers(u32 idx1, u32 idx2, bool swapNames)
{
	if (idx1 < MaterialRenderers.size() && idx2 < MaterialRenderers.size()) {
		irr::core::swap(MaterialRenderers[idx1].Renderer, MaterialRenderers[idx2].Renderer);
		if (swapNames)
			irr::core::swap(MaterialRenderers[idx1].Name, MaterialRenderers[idx2].Name);
	}
}